

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

uint32 __thiscall rw::Texture::streamGetSizeNative(Texture *this)

{
  uint32 uVar1;
  
  switch(this->raster->platform) {
  case 4:
    uVar1 = ps2::getSizeNativeTexture(this);
    return uVar1;
  case 5:
    uVar1 = xbox::getSizeNativeTexture(this);
    return uVar1;
  default:
    return 0;
  case 8:
    uVar1 = d3d8::getSizeNativeTexture(this);
    return uVar1;
  case 9:
    uVar1 = d3d9::getSizeNativeTexture(this);
    return uVar1;
  case 0xc:
    uVar1 = gl3::getSizeNativeTexture(this);
    return uVar1;
  }
}

Assistant:

uint32
Texture::streamGetSizeNative(void)
{
	if(this->raster->platform == PLATFORM_PS2)
		return ps2::getSizeNativeTexture(this);
	if(this->raster->platform == PLATFORM_D3D8)
		return d3d8::getSizeNativeTexture(this);
	if(this->raster->platform == PLATFORM_D3D9)
		return d3d9::getSizeNativeTexture(this);
	if(this->raster->platform == PLATFORM_XBOX)
		return xbox::getSizeNativeTexture(this);
	if(this->raster->platform == PLATFORM_GL3)
		return gl3::getSizeNativeTexture(this);
	assert(0 && "unsupported platform");
	return 0;
}